

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O0

void QtPromisePrivate::PromiseDispatch<int>::
     call<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>,std::function<int(double_const&)>,double_const&>
               (QPromiseResolve<int> *resolve,QPromiseReject<int> *reject,
               function<int_(const_double_&)> *fn,double *args)

{
  int local_2c;
  double *local_28;
  double *args_local;
  function<int_(const_double_&)> *fn_local;
  QPromiseReject<int> *reject_local;
  QPromiseResolve<int> *resolve_local;
  
  local_28 = args;
  args_local = (double *)fn;
  fn_local = (function<int_(const_double_&)> *)reject;
  reject_local = (QPromiseReject<int> *)resolve;
  local_2c = std::function<int_(const_double_&)>::operator()(fn,args);
  PromiseFulfill<int>::call<int,QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>
            (&local_2c,(QPromiseResolve<int> *)reject_local,(QPromiseReject<int> *)fn_local);
  return;
}

Assistant:

static void call(const Resolve& resolve, const Reject& reject, Functor fn, Args&&... args)
    {
        try {
            PromiseFulfill<Unqualified<Result>>::call(fn(std::forward<Args>(args)...),
                                                      resolve,
                                                      reject);
        } catch (...) {
            reject(std::current_exception());
        }
    }